

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

string * __thiscall
pstore::file::file_handle::path_abi_cxx11_(string *__return_storage_ptr__,file_handle *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->path_);
  return __return_storage_ptr__;
}

Assistant:

std::string path () const override { return path_; }